

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerSpreadCall(Lowerer *this,Instr *instr,CallFlags callFlags,bool setupProfiledVersion)

{
  code *pcVar1;
  bool bVar2;
  ushort extraArgsCount_00;
  CallFlags CVar3;
  int32 iVar4;
  Opnd *pOVar5;
  RegOpnd *functionObjOpnd_00;
  LabelInstr *afterCallLabel;
  Instr *pIVar6;
  undefined4 *puVar7;
  Opnd *pOVar8;
  IntConstOpnd *pIVar9;
  RegOpnd *opndArg;
  HelperCallOpnd *newSrc;
  JnHelperMethod fnHelper;
  HelperCallOpnd *helperOpnd;
  JitProfilingInstr *jitInstr;
  int32 argCount;
  unsigned_short extraArgsCount;
  Opnd *spreadIndicesOpnd;
  Instr *spreadIndicesInstr;
  LabelInstr *continueAfterExLabel;
  RegOpnd *functionObjOpnd;
  bool setupProfiledVersion_local;
  CallFlags callFlags_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar5 = IR::Instr::UnlinkSrc1(instr);
  functionObjOpnd_00 = IR::Opnd::AsRegOpnd(pOVar5);
  functionObjOpnd_00->field_0x18 = functionObjOpnd_00->field_0x18 & 0xfd | 2;
  CVar3 = Js::operator&(callFlags,CallFlags_New);
  bVar2 = Js::operator!(CVar3);
  if ((bVar2) && (!setupProfiledVersion)) {
    afterCallLabel = InsertContinueAfterExceptionLabelForDebugger(this->m_func,instr,false);
    LowererMD::GenerateFunctionObjectTest
              (&this->m_lowererMD,instr,functionObjOpnd_00,false,afterCallLabel);
  }
  pIVar6 = GetLdSpreadIndicesInstr(instr);
  if (pIVar6->m_opcode != LdSpreadIndices) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x69a1,"(spreadIndicesInstr->m_opcode == Js::OpCode::LdSpreadIndices)",
                       "spreadIndicesInstr->m_opcode == Js::OpCode::LdSpreadIndices");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pOVar5 = IR::Instr::UnlinkSrc1(pIVar6);
  pOVar8 = IR::Instr::UnlinkSrc2(pIVar6);
  IR::Instr::ReplaceSrc2(instr,pOVar8);
  CVar3 = Js::operator&(callFlags,CallFlags_New);
  bVar2 = Js::operator!(CVar3);
  functionObjOpnd._4_4_ = callFlags;
  if (bVar2) {
    pOVar8 = IR::Instr::GetDst(instr);
    CVar3 = CallFlags_NotUsed;
    if (pOVar8 != (Opnd *)0x0) {
      CVar3 = CallFlags_Value;
    }
    functionObjOpnd._4_4_ = Js::operator|(callFlags,CVar3);
  }
  extraArgsCount_00 = 2;
  if (setupProfiledVersion) {
    extraArgsCount_00 = 5;
  }
  iVar4 = LowererMD::LowerCallArgs
                    (&this->m_lowererMD,instr,(ushort)functionObjOpnd._4_4_,extraArgsCount_00);
  if (setupProfiledVersion) {
    pIVar9 = IR::Opnd::CreateProfileIdOpnd
                       (*(ProfileId *)((long)&instr[1]._vptr_Instr + 2),this->m_func);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&pIVar9->super_Opnd);
    pIVar9 = IR::Opnd::CreateProfileIdOpnd(*(ProfileId *)&instr[1]._vptr_Instr,this->m_func);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&pIVar9->super_Opnd);
    opndArg = IR::Opnd::CreateFramePointerOpnd(this->m_func);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg->super_Opnd);
  }
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&functionObjOpnd_00->super_Opnd);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,pOVar5);
  fnHelper = HelperSpreadCall;
  if (setupProfiledVersion) {
    fnHelper = HelperProfiledNewScObjArraySpread;
  }
  newSrc = IR::HelperCallOpnd::New(fnHelper,this->m_func);
  IR::Instr::SetSrc1(instr,&newSrc->super_Opnd);
  pIVar6 = LowererMD::LowerCall(&this->m_lowererMD,instr,(ArgSlot)iVar4);
  return pIVar6;
}

Assistant:

IR::Instr *
Lowerer::LowerSpreadCall(IR::Instr *instr, Js::CallFlags callFlags, bool setupProfiledVersion)
{
    // Get the target function object, and emit function object test.
    IR::RegOpnd * functionObjOpnd = instr->UnlinkSrc1()->AsRegOpnd();
    functionObjOpnd->m_isCallArg = true;

    if (!(callFlags & Js::CallFlags_New) && !setupProfiledVersion)
    {
        IR::LabelInstr* continueAfterExLabel = InsertContinueAfterExceptionLabelForDebugger(m_func, instr, false);
        this->m_lowererMD.GenerateFunctionObjectTest(instr, functionObjOpnd, false, continueAfterExLabel);
    }

    IR::Instr *spreadIndicesInstr;

    spreadIndicesInstr = GetLdSpreadIndicesInstr(instr);
    Assert(spreadIndicesInstr->m_opcode == Js::OpCode::LdSpreadIndices);

    // Get AuxArray
    IR::Opnd *spreadIndicesOpnd = spreadIndicesInstr->UnlinkSrc1();
    // Remove LdSpreadIndices from the argument chain
    instr->ReplaceSrc2(spreadIndicesInstr->UnlinkSrc2());

    // Emit the normal args
    if (!(callFlags & Js::CallFlags_New))
    {
        callFlags = (Js::CallFlags)(callFlags | (instr->GetDst() ? Js::CallFlags_Value : Js::CallFlags_NotUsed));
    }

    // Profiled helper call requires three more parameters, ArrayProfileId, profileId, and the frame pointer.
    // This is just following the convention of HelperProfiledNewScObjArray call.
    const unsigned short extraArgsCount = setupProfiledVersion ? 5 : 2; // function object and AuxArray
    int32 argCount = this->m_lowererMD.LowerCallArgs(instr, (ushort)callFlags, extraArgsCount);

    // Emit our extra (first) args for the Spread helper in reverse order
    if (setupProfiledVersion)
    {
        IR::JitProfilingInstr* jitInstr = (IR::JitProfilingInstr*)instr;
        m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(jitInstr->arrayProfileId, m_func));
        m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(jitInstr->profileId, m_func));
        m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateFramePointerOpnd(m_func));
    }

    m_lowererMD.LoadHelperArgument(instr, functionObjOpnd);
    m_lowererMD.LoadHelperArgument(instr, spreadIndicesOpnd);

    // Change the call target to our helper
    IR::HelperCallOpnd *helperOpnd = IR::HelperCallOpnd::New(setupProfiledVersion ? IR::HelperProfiledNewScObjArraySpread : IR::HelperSpreadCall, this->m_func);
    instr->SetSrc1(helperOpnd);

    return this->m_lowererMD.LowerCall(instr, (Js::ArgSlot)argCount);
}